

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmPre.c
# Opt level: O2

void Ifd_ObjPrint(Ifd_Man_t *p,int iLit)

{
  uint in_EAX;
  int iStack_10;
  ulong uStack_8;
  int Counter;
  
  uStack_8 = (ulong)in_EAX;
  if (iLit == 1) {
    iStack_10 = 0x31;
  }
  else {
    if (iLit != 0) {
      Ifd_ObjPrint_rec(p,iLit,&Counter,1);
      return;
    }
    iStack_10 = 0x30;
  }
  putchar(iStack_10);
  return;
}

Assistant:

void Ifd_ObjPrint( Ifd_Man_t * p, int iLit )
{
    int Counter = 0;
    if ( iLit == 0 )
        { printf( "0" ); return; }
    if ( iLit == 1 )
        { printf( "1" ); return; }
    Ifd_ObjPrint_rec( p, iLit, &Counter, 1 );
}